

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O1

void cftfsub(int n,float *a,float *w)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  uint l;
  ulong uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar5 = 2;
  if (8 < n) {
    cft1st(n,a,w);
    uVar5 = 8;
    if (0x20 < n) {
      uVar2 = 0x20;
      l = 8;
      do {
        uVar5 = uVar2;
        cftmdl(n,l,a,w);
        uVar2 = uVar5 * 4;
        l = uVar5;
      } while ((int)(uVar5 * 4) < n);
    }
  }
  if (uVar5 * 4 == n) {
    if (0 < (int)uVar5) {
      uVar3 = (ulong)uVar5;
      uVar4 = 0;
      do {
        fVar10 = (float)*(undefined8 *)(a + uVar4);
        fVar11 = (float)((ulong)*(undefined8 *)(a + uVar4) >> 0x20);
        fVar14 = (float)*(undefined8 *)(a + uVar3 + uVar4);
        fVar8 = fVar10 + fVar14;
        fVar6 = (float)((ulong)*(undefined8 *)(a + uVar3 + uVar4) >> 0x20);
        fVar9 = fVar11 + fVar6;
        fVar10 = fVar10 - fVar14;
        fVar11 = fVar11 - fVar6;
        fVar14 = (float)*(undefined8 *)(a + uVar3 * 2 + uVar4);
        fVar15 = (float)((ulong)*(undefined8 *)(a + uVar3 * 2 + uVar4) >> 0x20);
        fVar12 = (float)*(undefined8 *)(a + uVar3 * 3 + uVar4);
        fVar6 = fVar14 - fVar12;
        fVar13 = (float)((ulong)*(undefined8 *)(a + uVar3 * 3 + uVar4) >> 0x20);
        fVar7 = fVar15 - fVar13;
        fVar14 = fVar14 + fVar12;
        fVar15 = fVar15 + fVar13;
        *(ulong *)(a + uVar4) = CONCAT44(fVar9 + fVar15,fVar8 + fVar14);
        *(ulong *)(a + uVar3 * 2 + uVar4) = CONCAT44(fVar9 - fVar15,fVar8 - fVar14);
        a[uVar3 + uVar4] = fVar10 - fVar7;
        a[uVar3 + uVar4 + 1] = fVar11 + fVar6;
        a[uVar3 * 3 + uVar4] = fVar7 + fVar10;
        a[uVar3 * 3 + uVar4 + 1] = fVar11 - fVar6;
        uVar4 = uVar4 + 2;
      } while (uVar4 < uVar3);
    }
  }
  else if (0 < (int)uVar5) {
    uVar3 = (ulong)uVar5;
    uVar4 = 0;
    do {
      uVar1 = *(undefined8 *)(a + uVar3 + uVar4);
      fVar14 = (float)*(undefined8 *)(a + uVar4);
      fVar6 = (float)((ulong)*(undefined8 *)(a + uVar4) >> 0x20);
      fVar15 = (float)uVar1;
      a[uVar4] = fVar15 + fVar14;
      a[uVar4 + 1] = fVar6 + a[uVar3 + uVar4 + 1];
      *(ulong *)(a + uVar3 + uVar4) =
           CONCAT44(fVar6 - (float)((ulong)uVar1 >> 0x20),fVar14 - fVar15);
      uVar4 = uVar4 + 2;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

void cftfsub(int n, float *a, float *w)
{
    void cft1st(int n, float *a, float *w);
    void cftmdl(int n, int l, float *a, float *w);
    int j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}